

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O0

RC __thiscall QL_Manager::CleanUpRun(QL_Manager *this,Attr *attributes,RM_FileHandle *relFH)

{
  RC rc;
  RM_FileHandle *relFH_local;
  Attr *attributes_local;
  QL_Manager *this_local;
  
  this_local._4_4_ = RM_Manager::CloseFile(this->rmm,relFH);
  if ((this_local._4_4_ == 0) &&
     (this_local._4_4_ = SM_Manager::CleanUpAttr(this->smm,attributes,this->relEntries->attrCount),
     this_local._4_4_ == 0)) {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC QL_Manager::CleanUpRun(Attr* attributes, RM_FileHandle &relFH){
  RC rc = 0;
  if( (rc = rmm.CloseFile(relFH)))
    return (rc);

  // Destroy and close the pointers in Attr struct
  if((rc = smm.CleanUpAttr(attributes, relEntries->attrCount)))
    return (rc);
  return (0);
}